

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall
sf::Texture::update(Texture *this,Uint8 *pixels,uint width,uint height,uint x,uint y)

{
  Uint64 UVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  uint *in_RDI;
  int in_R8D;
  int in_R9D;
  TextureSaver save;
  TransientContextLock lock;
  char *in_stack_000000e0;
  uint in_stack_000000ec;
  char *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  TransientContextLock *in_stack_ffffffffffffffb0;
  
  if (*in_RDI < (uint)(in_R8D + in_EDX)) {
    __assert_fail("x + width <= m_size.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                  ,0x19d,
                  "void sf::Texture::update(const Uint8 *, unsigned int, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if ((uint)(in_R9D + in_ECX) <= in_RDI[1]) {
    if ((in_RSI != 0) && (in_RDI[4] != 0)) {
      GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffffb0);
      priv::TextureSaver::TextureSaver
                ((TextureSaver *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      glBindTexture(0xde1,in_RDI[4]);
      priv::glCheckError(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
      uVar2 = 0x1401;
      glTexSubImage2D(0xde1,0,in_R8D,in_R9D,in_EDX,in_ECX,0x1908,0x1401,in_RSI);
      priv::glCheckError(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
      glTexParameteri(0xde1,0x2801,(byte)in_RDI[5] & 1 | 0x2600);
      priv::glCheckError(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
      *(undefined1 *)((long)in_RDI + 0x19) = 0;
      *(undefined1 *)((long)in_RDI + 0x17) = 0;
      UVar1 = anon_unknown.dwarf_86926::getUniqueId();
      *(Uint64 *)(in_RDI + 8) = UVar1;
      glFlush();
      priv::glCheckError(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
      priv::TextureSaver::~TextureSaver((TextureSaver *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
      GlResource::TransientContextLock::~TransientContextLock
                ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
    }
    return;
  }
  __assert_fail("y + height <= m_size.y",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                ,0x19e,
                "void sf::Texture::update(const Uint8 *, unsigned int, unsigned int, unsigned int, unsigned int)"
               );
}

Assistant:

void Texture::update(const Uint8* pixels, unsigned int width, unsigned int height, unsigned int x, unsigned int y)
{
    assert(x + width <= m_size.x);
    assert(y + height <= m_size.y);

    if (pixels && m_texture)
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the given array to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}